

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_randomnumberutil.cpp
# Opt level: O1

void __thiscall
RandomNumberUtil_GetRandomBytesEmpty_Test::TestBody(RandomNumberUtil_GetRandomBytesEmpty_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  ByteData local_68;
  AssertHelper local_50;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  string local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  
  cfd::core::RandomNumberUtil::GetRandomBytes(&local_20,0);
  cfd::core::ByteData::ByteData(&local_68,&local_20);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_40,&local_68);
  pcVar2 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_50,"ByteData(bytes).GetHex().c_str()","\"\"",
             local_40._M_dataplus._M_p,"");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_50.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_48.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_randomnumberutil.cpp"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_40._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
      }
      local_40._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish +
       -(long)local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_50.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_40,"bytes.size()","static_cast<size_t>(size)",
             (unsigned_long *)&local_68,(unsigned_long *)&local_50);
  if ((char)local_40._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_68);
    if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_40._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_randomnumberutil.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((long *)local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (long *)0x0)) {
        (**(code **)(*(long *)local_68.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
      local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_40._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(RandomNumberUtil, GetRandomBytesEmpty) {
  int size = 0;
  std::vector<uint8_t> bytes = RandomNumberUtil::GetRandomBytes(size);
  EXPECT_STREQ(ByteData(bytes).GetHex().c_str(), "");
  EXPECT_EQ(bytes.size(), static_cast<size_t>(size));
}